

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::bitcast_expression
          (CompilerGLSL *this,SPIRType *target_type,BaseType expr_type,string *expr)

{
  undefined4 in_register_00000014;
  SPIRType *pSVar1;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  undefined1 local_180 [8];
  SPIRType src_type;
  string *expr_local;
  BaseType expr_type_local;
  SPIRType *target_type_local;
  CompilerGLSL *this_local;
  
  pSVar1 = (SPIRType *)CONCAT44(in_register_00000014,expr_type);
  if (*(int *)&(pSVar1->super_IVariant).field_0xc == (int)expr) {
    ::std::__cxx11::string::string((string *)this,in_R8);
  }
  else {
    src_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)in_R8;
    SPIRType::SPIRType((SPIRType *)local_180,pSVar1);
    src_type.super_IVariant._vptr_IVariant._4_4_ = (int)expr;
    (*(target_type->super_IVariant)._vptr_IVariant[0x34])
              (local_1a0,target_type,pSVar1,(SPIRType *)local_180);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              ((spirv_cross *)this,local_1a0,(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               src_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x4dff7a);
    ::std::__cxx11::string::~string((string *)local_1a0);
    SPIRType::~SPIRType((SPIRType *)local_180);
  }
  return this;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(const SPIRType &target_type, SPIRType::BaseType expr_type,
                                             const std::string &expr)
{
	if (target_type.basetype == expr_type)
		return expr;

	auto src_type = target_type;
	src_type.basetype = expr_type;
	return join(bitcast_glsl_op(target_type, src_type), "(", expr, ")");
}